

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O0

void __thiscall
SQCompilation::CheckerVisitor::checkVariableMismatchForLoop(CheckerVisitor *this,ForStatement *loop)

{
  bool bVar1;
  TreeOp TVar2;
  int iVar3;
  ValueDecl *this_00;
  BinExpr *this_01;
  BinExpr *this_02;
  Node *pNVar4;
  Id *pIVar5;
  Node *this_03;
  SQChar *pSVar6;
  ForStatement *in_RSI;
  CheckerVisitor *in_RDI;
  Expr *arg;
  Expr *lhs;
  Expr *r;
  Expr *l_1;
  BinExpr *bin;
  VarDecl *decl;
  Expr *l;
  Expr *mod;
  Expr *cond;
  Node *init;
  SQChar *varname;
  Expr *in_stack_ffffffffffffff80;
  SQChar *local_18;
  
  if ((in_RDI->effectsOnly & 1U) != 0) {
    return;
  }
  local_18 = (SQChar *)0x0;
  this_00 = (ValueDecl *)ForStatement::initializer(in_RSI);
  this_01 = (BinExpr *)ForStatement::condition(in_RSI);
  this_02 = (BinExpr *)ForStatement::modifier(in_RSI);
  if (this_00 != (ValueDecl *)0x0) {
    TVar2 = Node::op((Node *)this_00);
    if (TVar2 == TO_ASSIGN) {
      pNVar4 = &BinExpr::lhs((BinExpr *)this_00)->super_Node;
      TVar2 = Node::op(pNVar4);
      if (TVar2 == TO_ID) {
        pIVar5 = Node::asId(pNVar4);
        local_18 = Id::id(pIVar5);
      }
    }
    TVar2 = Node::op((Node *)this_00);
    if (TVar2 == TO_VAR) {
      local_18 = ValueDecl::name(this_00);
    }
  }
  if (((local_18 != (char *)0x0) && (this_01 != (BinExpr *)0x0)) &&
     (bVar1 = isBinaryArith(in_stack_ffffffffffffff80), bVar1)) {
    pNVar4 = &BinExpr::lhs(this_01)->super_Node;
    this_03 = &BinExpr::rhs(this_01)->super_Node;
    TVar2 = Node::op(pNVar4);
    if (TVar2 == TO_ID) {
      pIVar5 = Node::asId(pNVar4);
      pSVar6 = Id::id(pIVar5);
      iVar3 = strcmp(pSVar6,local_18);
      if (iVar3 != 0) {
        TVar2 = Node::op(this_03);
        if (TVar2 == TO_ID) {
          pIVar5 = Node::asId(this_03);
          pSVar6 = Id::id(pIVar5);
          iVar3 = strcmp(pSVar6,local_18);
          if (iVar3 == 0) goto LAB_00190664;
        }
        report(in_RDI,(Node *)this_01,0x75);
      }
    }
  }
LAB_00190664:
  if ((local_18 != (char *)0x0) && (this_02 != (BinExpr *)0x0)) {
    bVar1 = isAssignExpr((Expr *)0x190686);
    if (bVar1) {
      pNVar4 = &BinExpr::lhs(this_02)->super_Node;
      TVar2 = Node::op(pNVar4);
      if (TVar2 == TO_ID) {
        pIVar5 = Node::asId(pNVar4);
        pSVar6 = Id::id(pIVar5);
        iVar3 = strcmp(local_18,pSVar6);
        if (iVar3 != 0) {
          report(in_RDI,(Node *)this_02,0x75);
        }
      }
    }
    TVar2 = Node::op((Node *)this_02);
    if (TVar2 == TO_INC) {
      pNVar4 = &IncExpr::argument((IncExpr *)this_02)->super_Node;
      TVar2 = Node::op(pNVar4);
      if (TVar2 == TO_ID) {
        pIVar5 = Node::asId(pNVar4);
        pSVar6 = Id::id(pIVar5);
        iVar3 = strcmp(local_18,pSVar6);
        if (iVar3 != 0) {
          report(in_RDI,(Node *)this_02,0x75);
        }
      }
    }
  }
  return;
}

Assistant:

void CheckerVisitor::checkVariableMismatchForLoop(ForStatement *loop) {

  if (effectsOnly)
    return;

  const SQChar *varname = nullptr;
  Node *init = loop->initializer();
  Expr *cond = loop->condition();
  Expr *mod = loop->modifier();

  if (init) {
    if (init->op() == TO_ASSIGN) {
      Expr *l = static_cast<BinExpr *>(init)->lhs();
      if (l->op() == TO_ID)
        varname = l->asId()->id();
    }

    if (init->op() == TO_VAR) {
      VarDecl *decl = static_cast<VarDecl *>(init);
      varname = decl->name();
    }
  }

  if (varname && cond) {
    if (isBinaryArith(cond)) {
      BinExpr *bin = static_cast<BinExpr *>(cond);
      Expr *l = bin->lhs();
      Expr *r = bin->rhs();

      if (l->op() == TO_ID) {
        if (strcmp(l->asId()->id(), varname) != 0) {
          if (r->op() != TO_ID || (strcmp(r->asId()->id(), varname) != 0)) {
            report(cond, DiagnosticsId::DI_MISMATCH_LOOP_VAR);
          }
        }
      }
    }
  }

  if (varname && mod) {
    if (isAssignExpr(mod)) {
      Expr *lhs = static_cast<BinExpr *>(mod)->lhs();
      if (lhs->op() == TO_ID) {
        if (strcmp(varname, lhs->asId()->id()) != 0) {
          report(mod, DiagnosticsId::DI_MISMATCH_LOOP_VAR);
        }
      }
    }

    if (mod->op() == TO_INC) {
      Expr *arg = static_cast<IncExpr *>(mod)->argument();
      if (arg->op() == TO_ID) {
        if (strcmp(varname, arg->asId()->id()) != 0) {
          report(mod, DiagnosticsId::DI_MISMATCH_LOOP_VAR);
        }
      }
    }
  }
}